

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O1

bool __thiscall COLLADASaxFWL::NodeLoader::data__skeleton(NodeLoader *this,URI *value)

{
  size_t *psVar1;
  InstanceControllerData *this_00;
  _Node *p_Var2;
  
  this_00 = this->mCurrentInstanceControllerData;
  if (this_00 != (InstanceControllerData *)0x0) {
    p_Var2 = std::__cxx11::list<COLLADABU::URI,std::allocator<COLLADABU::URI>>::
             _M_create_node<COLLADABU::URI_const&>
                       ((list<COLLADABU::URI,std::allocator<COLLADABU::URI>> *)this_00,value);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    psVar1 = &(this_00->skeletonRoots).
              super__List_base<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    std::vector<COLLADABU::URI,_std::allocator<COLLADABU::URI>_>::push_back
              (&this->mCurrentInstanceControllerData->instanceController->mSkeletons,value);
  }
  return true;
}

Assistant:

bool NodeLoader::data__skeleton( COLLADABU::URI value )
	{
		if (mCurrentInstanceControllerData)
		{
			mCurrentInstanceControllerData->skeletonRoots.push_back( value );
            mCurrentInstanceControllerData->instanceController->skeletons().push_back( value );
		}

		return true;
	}